

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * QString::number(QString *__return_storage_ptr__,double n,char format,int precision)

{
  char cVar1;
  DoubleForm form;
  undefined7 in_register_00000031;
  bool uppercase;
  
  uppercase = (int)CONCAT71(in_register_00000031,format) - 0x41U < 0x1a;
  cVar1 = format + ' ';
  if (!uppercase) {
    cVar1 = format;
  }
  form = DFSignificantDigits;
  if (cVar1 != 'g') {
    form = (uint)(cVar1 != 'e');
  }
  qdtoBasicLatin(__return_storage_ptr__,n,form,precision,uppercase);
  return __return_storage_ptr__;
}

Assistant:

QString QString::number(double n, char format, int precision)
{
    QLocaleData::DoubleForm form = QLocaleData::DFDecimal;

    switch (QtMiscUtils::toAsciiLower(format)) {
        case 'f':
            form = QLocaleData::DFDecimal;
            break;
        case 'e':
            form = QLocaleData::DFExponent;
            break;
        case 'g':
            form = QLocaleData::DFSignificantDigits;
            break;
        default:
#if defined(QT_CHECK_RANGE)
            qWarning("QString::setNum: Invalid format char '%c'", format);
#endif
            break;
    }

    return qdtoBasicLatin(n, form, precision, isAsciiUpper(format));
}